

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strencodings.cpp
# Opt level: O3

optional<unsigned_long> ParseByteUnits(string_view str,ByteUnit default_multiplier)

{
  byte bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  _Storage<unsigned_long,_true> in_RCX;
  ByteUnit BVar4;
  undefined8 uVar5;
  size_t sVar6;
  char *__last;
  char *__first;
  long in_FS_OFFSET;
  bool bVar7;
  bool bVar8;
  __integer_from_chars_result_type<unsigned_long> _Var9;
  optional<unsigned_long> oVar10;
  unsigned_long result;
  ulong local_20;
  long local_18;
  
  __first = str._M_str;
  sVar6 = str._M_len;
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (sVar6 != 0) {
    bVar1 = __first[sVar6 - 1];
    if (bVar1 < 0x67) {
      if (0x4c < bVar1) {
        if (bVar1 == 0x4d) {
          BVar4 = M;
        }
        else {
          if (bVar1 != 0x54) goto LAB_001c258e;
          BVar4 = T;
        }
        goto LAB_001c2588;
      }
      if (bVar1 == 0x47) {
        BVar4 = G;
        goto LAB_001c2588;
      }
      if (bVar1 == 0x4b) {
        BVar4 = K;
        goto LAB_001c2588;
      }
    }
    else {
      if (bVar1 < 0x6d) {
        if (bVar1 == 0x67) {
          BVar4 = g;
        }
        else {
          BVar4 = k;
          if (bVar1 != 0x6b) goto LAB_001c258e;
        }
      }
      else if (bVar1 == 0x6d) {
        BVar4 = m;
      }
      else {
        if (bVar1 != 0x74) goto LAB_001c258e;
        BVar4 = t;
      }
LAB_001c2588:
      sVar6 = sVar6 - 1;
      default_multiplier = BVar4;
    }
LAB_001c258e:
    __last = __first + sVar6;
    uVar5 = 0;
    _Var9 = std::from_chars<unsigned_long>(__first,__last,&local_20,10);
    bVar7 = _Var9.ptr == __last;
    bVar8 = _Var9.ec == 0;
    in_RCX._1_7_ = (undefined7)((ulong)uVar5 >> 8);
    in_RCX._0_1_ = bVar8 && bVar7;
    if (bVar8 && bVar7) {
      in_RCX._M_value = local_20 * default_multiplier;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = default_multiplier;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = local_20;
      uVar5 = CONCAT71(SUB167(auVar2 * auVar3,9),SUB168(auVar2 * auVar3,8) == 0);
      goto LAB_001c25d1;
    }
  }
  uVar5 = 0;
LAB_001c25d1:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_18) {
    __stack_chk_fail();
  }
  oVar10.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._8_8_ = uVar5;
  oVar10.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value = in_RCX._M_value;
  return (optional<unsigned_long>)
         oVar10.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>;
}

Assistant:

std::optional<uint64_t> ParseByteUnits(std::string_view str, ByteUnit default_multiplier)
{
    if (str.empty()) {
        return std::nullopt;
    }
    auto multiplier = default_multiplier;
    char unit = str.back();
    switch (unit) {
    case 'k':
        multiplier = ByteUnit::k;
        break;
    case 'K':
        multiplier = ByteUnit::K;
        break;
    case 'm':
        multiplier = ByteUnit::m;
        break;
    case 'M':
        multiplier = ByteUnit::M;
        break;
    case 'g':
        multiplier = ByteUnit::g;
        break;
    case 'G':
        multiplier = ByteUnit::G;
        break;
    case 't':
        multiplier = ByteUnit::t;
        break;
    case 'T':
        multiplier = ByteUnit::T;
        break;
    default:
        unit = 0;
        break;
    }

    uint64_t unit_amount = static_cast<uint64_t>(multiplier);
    auto parsed_num = ToIntegral<uint64_t>(unit ? str.substr(0, str.size() - 1) : str);
    if (!parsed_num || parsed_num > std::numeric_limits<uint64_t>::max() / unit_amount) { // check overflow
        return std::nullopt;
    }
    return *parsed_num * unit_amount;
}